

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

bool __thiscall Js::JavascriptFunction::HasRestrictedProperties(JavascriptFunction *this)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  
  if (((((((this->functionInfo).ptr)->attributes &
         (Method|Async|Lambda|ClassConstructor|ClassMethod)) == None) &&
       (iVar2 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(),
       (char)iVar2 == '\0')) && (BVar3 = IsStrictMode(this), BVar3 == 0)) &&
     ((BVar3 = IsScriptFunction(this), BVar3 != 0 && (bVar1 = IsLibraryCode(this), !bVar1)))) {
    return (JavascriptFunction *)
           (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).functionPrototype.ptr != this;
  }
  return false;
}

Assistant:

bool JavascriptFunction::HasRestrictedProperties() const
    {
        return !(
            this->functionInfo->IsClassMethod() ||
            this->functionInfo->IsClassConstructor() ||
            this->functionInfo->IsMethod() ||
            this->functionInfo->IsLambda() ||
            this->functionInfo->IsAsync() ||
            this->IsGeneratorFunction() ||
            this->IsStrictMode() ||
            !this->IsScriptFunction() || // -> (BoundFunction || RuntimeFunction) // (RuntimeFunction = Native-defined built-in library functions)
            this->IsLibraryCode() || // JS-defined built-in library functions
            this == this->GetLibrary()->GetFunctionPrototype() // the intrinsic %FunctionPrototype% (original value of Function.prototype)
            );
    }